

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O0

Platform * __thiscall efsw::Platform::findMountPoint(Platform *this,string *file)

{
  bool bVar1;
  int iVar2;
  char *__file;
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  undefined1 local_268 [8];
  stat st;
  string local_1d0 [32];
  FileSystem local_1b0 [8];
  string dir;
  allocator local_185 [13];
  string local_178 [8];
  string mp;
  undefined1 local_158 [8];
  stat file_stat;
  stat last_stat;
  string cwd;
  string *file_local;
  
  FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
  __file = (char *)std::__cxx11::string::c_str();
  stat(__file,(stat *)local_158);
  std::__cxx11::string::string(local_178);
  bVar1 = efsw::FileSystem::isDirectory(file);
  if (bVar1) {
    memcpy(file_stat.__glibc_reserved + 2,local_158,0x90);
    bVar1 = FileSystem::changeWorkingDirectory(file);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",local_185);
      std::allocator<char>::~allocator((allocator<char> *)local_185);
      goto LAB_00113281;
    }
  }
  else {
    std::__cxx11::string::string(local_1d0,(string *)file);
    efsw::FileSystem::pathRemoveFileName(local_1b0,(string *)local_1d0);
    std::__cxx11::string::~string(local_1d0);
    bVar1 = FileSystem::changeWorkingDirectory((string *)local_1b0);
    if (bVar1) {
      iVar2 = stat(".",(stat *)(file_stat.__glibc_reserved + 2));
      if (iVar2 < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)this,"",(allocator *)((long)st.__glibc_reserved + 0x16));
        std::allocator<char>::~allocator((allocator<char> *)((long)st.__glibc_reserved + 0x16));
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)this,"",(allocator *)((long)st.__glibc_reserved + 0x17));
      std::allocator<char>::~allocator((allocator<char> *)((long)st.__glibc_reserved + 0x17));
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_1b0);
    if (bVar1) goto LAB_00113281;
  }
  while (iVar2 = stat("..",(stat *)local_268), -1 < iVar2) {
    if ((local_268 != (undefined1  [8])file_stat.__glibc_reserved[2]) ||
       (st.st_dev == last_stat.st_dev)) {
      FileSystem::getCurrentWorkingDirectory_abi_cxx11_();
      std::__cxx11::string::operator=(local_178,local_2b0);
      std::__cxx11::string::~string(local_2b0);
      break;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"..",&local_289);
    bVar1 = FileSystem::changeWorkingDirectory((string *)local_288);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    memcpy(file_stat.__glibc_reserved + 2,local_268,0x90);
  }
  FileSystem::changeWorkingDirectory((string *)(last_stat.__glibc_reserved + 2));
  std::__cxx11::string::string((string *)this,local_178);
LAB_00113281:
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string((string *)(last_stat.__glibc_reserved + 2));
  return this;
}

Assistant:

std::string findMountPoint( std::string file ) {
	std::string cwd = FileSystem::getCurrentWorkingDirectory();
	struct stat last_stat;
	struct stat file_stat;

	stat( file.c_str(), &file_stat );

	std::string mp;

	if ( efsw::FileSystem::isDirectory( file ) ) {
		last_stat = file_stat;

		if ( !FileSystem::changeWorkingDirectory( file ) )
			return "";
	} else {
		std::string dir = efsw::FileSystem::pathRemoveFileName( file );

		if ( !FileSystem::changeWorkingDirectory( dir ) )
			return "";

		if ( stat( ".", &last_stat ) < 0 )
			return "";
	}

	while ( true ) {
		struct stat st;

		if ( stat( "..", &st ) < 0 )
			goto done;

		if ( st.st_dev != last_stat.st_dev || st.st_ino == last_stat.st_ino )
			break;

		if ( !FileSystem::changeWorkingDirectory( ".." ) ) {
			goto done;
		}

		last_stat = st;
	}

	/* Finally reached a mount point, see what it's called.  */
	mp = FileSystem::getCurrentWorkingDirectory();

done:
	FileSystem::changeWorkingDirectory( cwd );

	return mp;
}